

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

void __thiscall CNetAddr::SetLegacyIPv6(CNetAddr *this,Span<const_unsigned_char> ipv6)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  long lStack_30;
  uchar local_21;
  Span<const_unsigned_char> ipv6_local;
  
  ipv6_local.m_size = ipv6.m_size;
  ipv6_local.m_data = ipv6.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (ipv6_local.m_size != 0x10) {
    __assert_fail("ipv6.size() == ADDR_IPV6_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x8b,"void CNetAddr::SetLegacyIPv6(Span<const uint8_t>)");
  }
  bVar2 = util::HasPrefix<Span<unsigned_char_const>,12ul>(&ipv6_local,&IPV4_IN_IPV6_PREFIX);
  if (bVar2) {
    this->m_net = NET_IPV4;
    lStack_30 = 0xc;
  }
  else {
    bVar2 = util::HasPrefix<Span<unsigned_char_const>,6ul>(&ipv6_local,&TORV2_IN_IPV6_PREFIX);
    if (bVar2) {
      this->m_net = NET_IPV6;
      local_21 = '\0';
      prevector<16U,_unsigned_char,_unsigned_int,_int>::assign(&this->m_addr,0x10,&local_21);
      goto LAB_00a95e79;
    }
    bVar2 = util::HasPrefix<Span<unsigned_char_const>,6ul>(&ipv6_local,&INTERNAL_IN_IPV6_PREFIX);
    if (bVar2) {
      this->m_net = NET_INTERNAL;
      lStack_30 = 6;
    }
    else {
      this->m_net = NET_IPV6;
      lStack_30 = 0;
    }
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
            (&this->m_addr,ipv6_local.m_data + lStack_30,ipv6_local.m_data + ipv6_local.m_size);
LAB_00a95e79:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CNetAddr::SetLegacyIPv6(Span<const uint8_t> ipv6)
{
    assert(ipv6.size() == ADDR_IPV6_SIZE);

    size_t skip{0};

    if (HasPrefix(ipv6, IPV4_IN_IPV6_PREFIX)) {
        // IPv4-in-IPv6
        m_net = NET_IPV4;
        skip = sizeof(IPV4_IN_IPV6_PREFIX);
    } else if (HasPrefix(ipv6, TORV2_IN_IPV6_PREFIX)) {
        // TORv2-in-IPv6 (unsupported). Unserialize as !IsValid(), thus ignoring them.
        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
        return;
    } else if (HasPrefix(ipv6, INTERNAL_IN_IPV6_PREFIX)) {
        // Internal-in-IPv6
        m_net = NET_INTERNAL;
        skip = sizeof(INTERNAL_IN_IPV6_PREFIX);
    } else {
        // IPv6
        m_net = NET_IPV6;
    }

    m_addr.assign(ipv6.begin() + skip, ipv6.end());
}